

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_paged_audio_buffer_data_get_length_in_pcm_frames
                    (ma_paged_audio_buffer_data *pData,ma_uint64 *pLength)

{
  ma_result mVar1;
  ma_paged_audio_buffer_page *pmVar2;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pData != (ma_paged_audio_buffer_data *)0x0)) {
    mVar1 = MA_SUCCESS;
    for (pmVar2 = (pData->head).pNext; pmVar2 != (ma_paged_audio_buffer_page *)0x0;
        pmVar2 = pmVar2->pNext) {
      *pLength = *pLength + pmVar2->sizeInFrames;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_get_length_in_pcm_frames(ma_paged_audio_buffer_data* pData, ma_uint64* pLength)
{
    ma_paged_audio_buffer_page* pPage;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Calculate the length from the linked list. */
    for (pPage = (ma_paged_audio_buffer_page*)c89atomic_load_ptr(&pData->head.pNext); pPage != NULL; pPage = (ma_paged_audio_buffer_page*)c89atomic_load_ptr(&pPage->pNext)) {
        *pLength += pPage->sizeInFrames;
    }

    return MA_SUCCESS;
}